

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

void __thiscall delta_complex_t::add_edge(delta_complex_t *this,index_t i,index_t j,value_t val)

{
  pointer pvVar1;
  iterator iVar2;
  pointer pvVar3;
  pointer pcVar4;
  long lVar5;
  pointer pdVar6;
  long lVar7;
  pointer plVar8;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  index_t loc;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orient;
  allocator_type local_1f9;
  pointer local_1f8;
  pointer local_1f0;
  long local_1e8;
  value_t local_1dc;
  pointer local_1d8;
  pointer local_1d0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_1c8;
  vector<long,_std::allocator<long>_> local_1b0;
  vector<long,_std::allocator<long>_> local_198;
  vector<long,_std::allocator<long>_> local_180;
  vector<long,_std::allocator<long>_> local_168;
  vector<long,_std::allocator<long>_> local_150;
  undefined1 local_138 [64];
  pointer local_f8;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_f0 [2];
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_50;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_38;
  
  pvVar1 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = ((long)*(pointer *)
                      ((long)&pvVar1[1].
                              super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                              ._M_impl + 8) -
               *(long *)&pvVar1[1].
                         super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                         ._M_impl >> 3) * 0x34f72c234f72c235;
  local_1c8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (vector<long,_std::allocator<long>_> *)0x0;
  local_1c8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._16_8_ = (pointer)0x0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_1f8 = (pointer)j;
  local_1f0 = (pointer)i;
  local_1dc = val;
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::emplace_back<std::vector<long,std::allocator<long>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&local_1c8,(vector<long,_std::allocator<long>_> *)local_138);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  if ((long)local_1f0 < (long)local_1f8) {
    local_138._0_8_ = (pointer)0x1;
    iVar2._M_current =
         ((local_1c8.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        ((local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (local_1c8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,iVar2,(long *)local_138);
    }
    else {
      *iVar2._M_current = 1;
      ((local_1c8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<long,_std::allocator<long>_>)
      ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pvVar1 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1d8 = local_1f0;
    local_1d0 = local_1f8;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_1d8;
    std::vector<long,_std::allocator<long>_>::vector(&local_150,__l,&local_1f9);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_38,&local_1c8);
    delta_complex_cell_t::delta_complex_cell_t
              ((delta_complex_cell_t *)local_138,&local_150,&local_38,local_1dc,local_1e8);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar1 + 1,(delta_complex_cell_t *)local_138);
    std::
    _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_88);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_b8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(local_f0);
    if ((pointer)local_138._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._48_8_,(long)local_f8 - local_138._48_8_);
    }
    if ((pointer)local_138._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._24_8_,local_138._40_8_ - local_138._24_8_);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_38);
    if (local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar3 = (this->cliques).
             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = *(pointer *)
              ((long)&pvVar3[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data + 8);
    lVar5 = *(long *)&pvVar3[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data;
    local_1d8 = local_1f0;
    local_1d0 = local_1f8;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_1d8;
    std::vector<long,_std::allocator<long>_>::vector(&local_168,__l_00,&local_1f9);
    plVar8 = (pointer)(((long)pcVar4 - lVar5 >> 4) * 0x6db6db6db6db6db7);
    clique_t::clique_t((clique_t *)local_138,&local_168,(index_t)plVar8);
    std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
              (pvVar3 + 1,(clique_t *)local_138);
    std::
    _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_138 + 0x38));
    if ((pointer)local_138._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._24_8_,local_138._40_8_ - local_138._24_8_);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    if (local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pcVar4 = *(pointer *)
              ((long)&(this->cliques).
                      super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data + 8);
    iVar2._M_current =
         *(pointer *)
          ((long)&pcVar4[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
    if (iVar2._M_current ==
        *(pointer *)
         ((long)&pcVar4[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10)) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)(pcVar4 + -1),iVar2,&local_1e8);
    }
    else {
      *iVar2._M_current = local_1e8;
      *(long **)((long)&pcVar4[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8
                ) = iVar2._M_current + 1;
    }
    local_138._0_8_ = local_1f8;
    local_138._8_8_ = plVar8;
    std::
    _Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,long>>
              ((_Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(*(long *)&(((this->cliques).
                               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                             super__Vector_impl_data + (long)local_1f0 * 0x70 + 0x38));
  }
  else {
    local_138._0_8_ = (pointer)0x0;
    iVar2._M_current =
         ((local_1c8.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        ((local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (local_1c8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,iVar2,(long *)local_138);
    }
    else {
      *iVar2._M_current = 0;
      ((local_1c8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<long,_std::allocator<long>_>)
      ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pvVar1 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1d8 = local_1f8;
    local_1d0 = local_1f0;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_1d8;
    std::vector<long,_std::allocator<long>_>::vector(&local_180,__l_01,&local_1f9);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_50,&local_1c8);
    delta_complex_cell_t::delta_complex_cell_t
              ((delta_complex_cell_t *)local_138,&local_180,&local_50,local_1dc,local_1e8);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar1 + 1,(delta_complex_cell_t *)local_138);
    std::
    _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_88);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_b8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(local_f0);
    if ((pointer)local_138._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._48_8_,(long)local_f8 - local_138._48_8_);
    }
    if ((pointer)local_138._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._24_8_,local_138._40_8_ - local_138._24_8_);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_50);
    if (local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_138._0_8_ = local_1f8;
    local_138._8_8_ = local_1f0;
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)local_138;
    std::vector<long,_std::allocator<long>_>::vector(&local_198,__l_02,(allocator_type *)&local_1d8)
    ;
    plVar8 = (pointer)get_clique(this,&local_198);
    if (local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (plVar8 == (pointer)0xffffffffffffffff) {
      pvVar3 = (this->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = *(pointer *)
                ((long)&pvVar3[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                        super__Vector_impl_data + 8);
      lVar5 = *(long *)&pvVar3[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                        super__Vector_impl_data;
      local_1d8 = local_1f8;
      local_1d0 = local_1f0;
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)&local_1d8;
      std::vector<long,_std::allocator<long>_>::vector(&local_1b0,__l_03,&local_1f9);
      plVar8 = (pointer)(((long)pcVar4 - lVar5 >> 4) * 0x6db6db6db6db6db7);
      clique_t::clique_t((clique_t *)local_138,&local_1b0,(index_t)plVar8);
      std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
                (pvVar3 + 1,(clique_t *)local_138);
      std::
      _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(local_138 + 0x38));
      if ((pointer)local_138._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._24_8_,local_138._40_8_ - local_138._24_8_);
      }
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
      }
      if (local_1b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_138._0_8_ = local_1f0;
      local_138._8_8_ = plVar8;
      std::
      _Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<long,long>>
                ((_Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(*(long *)&(((this->cliques).
                                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                               super__Vector_impl_data + (long)local_1f8 * 0x70 + 0x38));
    }
    lVar5 = *(long *)&(this->cliques).
                      super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data;
    lVar7 = (long)plVar8 * 0x70;
    iVar2._M_current = *(long **)(lVar5 + 8 + lVar7);
    if (iVar2._M_current == *(long **)(lVar5 + 0x10 + lVar7)) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)(lVar5 + lVar7),iVar2,&local_1e8);
    }
    else {
      *iVar2._M_current = local_1e8;
      *(long **)((vector<long,std::allocator<long>> *)(lVar5 + lVar7) + 8) = iVar2._M_current + 1;
    }
  }
  delta_complex_cell_t::add_neighbour
            ((delta_complex_cell_t *)
             ((long)local_1f0 * 0xe8 +
             *(long *)&(((this->cells).
                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                       )._M_impl),(index_t)local_1f8,0);
  delta_complex_cell_t::add_neighbour
            ((delta_complex_cell_t *)
             ((long)local_1f8 * 0xe8 +
             *(long *)&(((this->cells).
                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                       )._M_impl),(index_t)local_1f0,1);
  lVar5 = *(long *)&(((this->cells).
                      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>)
                    ._M_impl;
  lVar7 = (long)local_1f0 * 0xe8;
  iVar2._M_current = *(long **)(lVar5 + 8 + lVar7);
  if (iVar2._M_current == *(long **)(lVar5 + 0x10 + lVar7)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)(lVar5 + lVar7),iVar2,&local_1e8);
  }
  else {
    *iVar2._M_current = local_1e8;
    *(long **)((vector<long,std::allocator<long>> *)(lVar5 + lVar7) + 8) = iVar2._M_current + 1;
  }
  lVar5 = *(long *)&(((this->cells).
                      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>)
                    ._M_impl;
  lVar7 = (long)local_1f8 * 0xe8;
  iVar2._M_current = *(long **)(lVar5 + 8 + lVar7);
  if (iVar2._M_current == *(long **)(lVar5 + 0x10 + lVar7)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)(lVar5 + lVar7),iVar2,&local_1e8);
  }
  else {
    *iVar2._M_current = local_1e8;
    *(long **)((vector<long,std::allocator<long>> *)(lVar5 + lVar7) + 8) = iVar2._M_current + 1;
  }
  pdVar6 = *(pointer *)
            ((long)&(this->cells).
                    super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                    _M_impl + 8);
  iVar2._M_current =
       *(pointer *)((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 0x10)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&pdVar6[-1].boundary,iVar2,(long *)&local_1f0);
  }
  else {
    *iVar2._M_current = (long)local_1f0;
    *(long **)((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8) =
         iVar2._M_current + 1;
  }
  pdVar6 = *(pointer *)
            ((long)&(this->cells).
                    super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                    _M_impl + 8);
  iVar2._M_current =
       *(pointer *)((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 0x10)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&pdVar6[-1].boundary,iVar2,(long *)&local_1f8);
  }
  else {
    *iVar2._M_current = (long)local_1f8;
    *(long **)((long)&pdVar6[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8) =
         iVar2._M_current + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

void add_edge(index_t i,index_t j,value_t val){
		//NOTE: We assume edges are added in increasing lexicographic order,
		//this avoids always checking if relevant 2-clique already in list
		//This could be changed and it would make the code easier to read,
		//But I think it is slightly faster this way, though probably a negligible amount
		index_t loc = cells[1].size();
		std::vector<std::vector<index_t>> new_orient;
		new_orient.push_back(std::vector<index_t>());
		if( i < j ){
			//When i < j create a new clique and a new face, with edge orientation 1
			//add the new face to the new clique and also add the cofaces to the clique
			new_orient[0].push_back(1);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{i,j},new_orient,val,loc));
			index_t cli_loc = cliques[1].size();
			cliques[1].push_back(clique_t(std::vector<index_t>{i,j},cli_loc));
			cliques[1].back().faces.push_back(loc);
			cliques[0][i].add_coface(j,cli_loc);
		} else{
			//When i > j  create a new face with orientation 0
			//then check if the clique already exists, if it does not then create it
			//then add the new face the the clique
			new_orient[0].push_back(0);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{j,i},new_orient,val,loc));
			index_t the_cli = get_clique(std::vector<index_t>{j,i});
			if(the_cli == -1){
				index_t cli_loc = cliques[1].size();
				cliques[1].push_back(clique_t(std::vector<index_t>{j,i},cli_loc));
				cliques[0][j].add_coface(i,cli_loc);
				the_cli = cli_loc;
			}
			cliques[1][the_cli].faces.push_back(loc);
		}
		//Add the relevent neighbour and coboundary information to the vertices
		cells[0][i].add_neighbour(j,0);
		cells[0][j].add_neighbour(i,1);
		cells[0][i].coboundary.push_back(loc);
		cells[0][j].coboundary.push_back(loc);
		//Add the vertices of faces of the new created face
		cells[1].back().boundary.push_back(i);
		cells[1].back().boundary.push_back(j);
	}